

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

EmulatorEvent host_step(Host *host)

{
  Emulator *e;
  EmulatorEvent event;
  Ticks TVar1;
  
  if ((host->rewind_state).rewinding == FALSE) {
    e = (host->hook_ctx).e;
    event = emulator_step(e);
    host_handle_event(host,event);
    TVar1 = emulator_get_ticks(e);
    host->last_ticks = TVar1;
    return event;
  }
  __assert_fail("!host->rewind_state.rewinding",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x1c2,
                "EmulatorEvent host_step(Host *)");
}

Assistant:

EmulatorEvent host_step(Host* host) {
  assert(!host->rewind_state.rewinding);
  Emulator* e = host_get_emulator(host);
  EmulatorEvent event = emulator_step(e);
  host_handle_event(host, event);
  host->last_ticks = emulator_get_ticks(e);
  return event;
}